

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAParameters.cpp
# Opt level: O2

bool __thiscall DSAParameters::deserialise(DSAParameters *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_90);
      if (sVar1 != 0) {
        ByteString::operator=(&this->p,&local_40);
        ByteString::operator=(&this->q,&local_68);
        bVar2 = true;
        ByteString::operator=(&this->g,&local_90);
        goto LAB_0012bc3e;
      }
    }
  }
  bVar2 = false;
LAB_0012bc3e:
  ByteString::~ByteString(&local_90);
  ByteString::~ByteString(&local_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool DSAParameters::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);

	return true;
}